

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O1

bool Kernel::EqHelper::hasGreaterEqualitySide(Literal *eq,Ordering *ord,TermList *lhs,TermList *rhs)

{
  bool bVar1;
  Result RVar2;
  TermList *pTVar3;
  
  RVar2 = Ordering::getEqualityArgumentOrder(ord,eq);
  if (RVar2 == INCOMPARABLE) {
    bVar1 = false;
  }
  else {
    if (RVar2 == LESS) {
      lhs->_content =
           (eq->super_Term)._args[(ulong)(*(uint *)&(eq->super_Term).field_0xc & 0xfffffff) - 1].
           _content;
      pTVar3 = (eq->super_Term)._args + (*(uint *)&(eq->super_Term).field_0xc & 0xfffffff);
    }
    else {
      lhs->_content =
           (eq->super_Term)._args[*(uint *)&(eq->super_Term).field_0xc & 0xfffffff]._content;
      pTVar3 = (eq->super_Term)._args +
               ((ulong)(*(uint *)&(eq->super_Term).field_0xc & 0xfffffff) - 1);
    }
    rhs->_content = pTVar3->_content;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool EqHelper::hasGreaterEqualitySide(Literal* eq, const Ordering& ord, TermList& lhs, TermList& rhs)
{
  ASS(eq->isEquality());

  switch(ord.getEqualityArgumentOrder(eq)) {
    case Ordering::INCOMPARABLE:
      return false;
    case Ordering::GREATER:
      lhs = *eq->nthArgument(0);
      rhs = *eq->nthArgument(1);
      return true;
    case Ordering::LESS:
      lhs = *eq->nthArgument(1);
      rhs = *eq->nthArgument(0);
      return true;
    //there should be no equality literals of equal terms
    case Ordering::EQUAL:
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}